

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  undefined *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  undefined8 *puVar6;
  void *contents;
  undefined8 *puVar7;
  undefined8 *puVar8;
  void *pvVar9;
  ulong uVar10;
  xml_parse_status xVar11;
  xml_document *pxVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  size_t local_58;
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_00382404;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar3 = std::wistream::tellg();
  if (lVar3 < 0) {
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    puVar8 = (undefined8 *)0x0;
    local_58 = 0;
    puVar7 = (undefined8 *)0x0;
    pxVar12 = this;
LAB_00382212:
    if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) goto code_r0x0038222c;
    contents = (void *)(*(code *)impl::(anonymous_namespace)::
                                 xml_memory_management_function_storage<int>::allocate)
                                 (local_58 + 1);
    if (contents != (void *)0x0) {
      pvVar5 = contents;
      if (puVar8 != (undefined8 *)0x0) {
        puVar7 = puVar8;
        do {
          if ((long)contents + local_58 < (ulong)((long)pvVar5 + puVar7[1])) {
            __assert_fail("write + chunk->size <= buffer + total",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                          ,0x1359,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
          memcpy(pvVar5,puVar7 + 2,puVar7[1]);
          pvVar5 = (void *)((long)pvVar5 + puVar7[1]);
          puVar7 = (undefined8 *)*puVar7;
        } while (puVar7 != (undefined8 *)0x0);
      }
      xVar11 = status_ok;
      if (pvVar5 != (void *)((long)contents + local_58)) {
        __assert_fail("write == buffer + total",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x135e,
                      "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                     );
      }
      goto joined_r0x00382399;
    }
    xVar11 = status_out_of_memory;
    goto LAB_0038238c;
  }
  auVar14 = std::wistream::tellg();
  lVar3 = auVar14._0_8_;
  local_58 = 0;
  xVar11 = status_io_error;
  std::wistream::seekg((long)stream,_S_beg);
  lVar4 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar3,auVar14._8_8_);
  contents = (void *)0x0;
  if (-1 < lVar3 && ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) == 0) {
    uVar10 = lVar4 - lVar3;
    if ((long)uVar10 < 0) {
      xVar11 = status_out_of_memory;
      local_58 = 0;
      contents = (void *)0x0;
    }
    else {
      pvVar5 = (void *)(*(code *)impl::(anonymous_namespace)::
                                 xml_memory_management_function_storage<int>::allocate)
                                 (uVar10 * 4 + 1);
      puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
      if (pvVar5 == (void *)0x0) {
        xVar11 = status_out_of_memory;
LAB_0038237a:
        local_58 = 0;
        contents = (void *)0x0;
        pvVar9 = pvVar5;
      }
      else {
        std::wistream::read((wchar_t *)stream,(long)pvVar5);
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          xVar11 = status_io_error;
          goto LAB_0038237a;
        }
        if (uVar10 < *(ulong *)(stream + 8)) {
          __assert_fail("actual_length <= read_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                        ,0x1383,
                        "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                       );
        }
        local_58 = *(ulong *)(stream + 8) << 2;
        xVar11 = status_ok;
        pvVar9 = (void *)0x0;
        contents = pvVar5;
      }
      if (pvVar9 != (void *)0x0) {
        (*(code *)puVar1)(pvVar9);
      }
    }
  }
LAB_003823f4:
  if (xVar11 == status_ok) {
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,contents,local_58,options,
               encoding_utf32_le,true,true,&this->_buffer);
    return __return_storage_ptr__;
  }
  xml_parse_result::xml_parse_result(__return_storage_ptr__);
  __return_storage_ptr__->status = xVar11;
LAB_00382404:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
code_r0x0038222c:
  puVar6 = (undefined8 *)
           (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                     allocate)(0x7fe8);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = (undefined8 *)0x0;
  }
  else {
    *puVar6 = 0;
    puVar6[1] = 0;
  }
  if (puVar6 == (undefined8 *)0x0) {
    pxVar12 = (xml_document *)0x3;
    bVar13 = false;
    puVar6 = puVar7;
  }
  else {
    puVar2 = puVar6;
    if (puVar7 != (undefined8 *)0x0) {
      *puVar7 = puVar6;
      puVar2 = puVar8;
    }
    puVar8 = puVar2;
    std::wistream::read((wchar_t *)stream,(long)(puVar6 + 2));
    lVar3 = *(long *)(stream + 8);
    puVar6[1] = lVar3 * 4;
    if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
        (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
      pxVar12 = (xml_document *)0x2;
      bVar13 = false;
    }
    else {
      uVar10 = lVar3 * 4 + local_58;
      bVar13 = local_58 <= uVar10;
      if (local_58 < uVar10) {
        local_58 = uVar10;
      }
      pxVar12 = (xml_document *)((ulong)pxVar12 & 0xffffffff);
      if (!bVar13) {
        pxVar12 = (xml_document *)0x3;
      }
    }
  }
  xVar11 = (xml_parse_status)pxVar12;
  puVar7 = puVar6;
  if (!bVar13) goto LAB_0038238c;
  goto LAB_00382212;
LAB_0038238c:
  local_58 = 0;
  contents = (void *)0x0;
joined_r0x00382399:
  while (puVar8 != (undefined8 *)0x0) {
    puVar7 = (undefined8 *)*puVar8;
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (puVar8);
    puVar8 = puVar7;
  }
  goto LAB_003823f4;
}

Assistant:

PUGI_IMPL_FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}